

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O2

void __thiscall
Assimp::IRRImporter::GenerateGraph
          (IRRImporter *this,Node *root,aiNode *rootOut,aiScene *scene,BatchLoader *batch,
          vector<aiMesh_*,_std::allocator<aiMesh_*>_> *meshes,
          vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *anims,
          vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *attach,
          vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *materials,uint *defMatIdx)

{
  float *pfVar1;
  float fVar2;
  pointer ppVar3;
  aiColor4D *paVar4;
  uint a_1;
  uint uVar5;
  aiScene *paVar6;
  aiMesh *paVar7;
  aiNode **ppaVar8;
  aiNode *this_00;
  uint *puVar9;
  Logger *pLVar10;
  uint uVar11;
  long lVar12;
  uint i;
  char *message;
  IRRImporter *pIVar13;
  aiMaterial *paVar14;
  ulong uVar15;
  pointer ppVar16;
  int iVar17;
  ulong uVar18;
  aiVector3t<float> aVar19;
  aiTextureMapping mode;
  int idx;
  float fStack_84;
  undefined8 local_80;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *local_68;
  pointer local_60;
  ulong local_58;
  aiScene *local_50;
  
  local_58 = (long)(meshes->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(meshes->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  local_50 = scene;
  local_80 = (aiNode *)CONCAT44(local_80._4_4_,(float)local_80);
  switch(root->type) {
  case CUBE:
    paVar7 = StandardShapes::MakeMesh(StandardShapes::MakeHexahedron);
    idx = (int)paVar7;
    fStack_84 = (float)((ulong)paVar7 >> 0x20);
    std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)meshes,(aiMesh **)&idx);
    pIVar13 = (IRRImporter *)&root->scaling;
    aiVector3t<float>::operator*=((aiVector3t<float> *)pIVar13,root->sphereRadius);
    CopyMaterial(pIVar13,materials,&root->materials,defMatIdx,
                 (meshes->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish[-1]);
    paVar14 = (materials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
              super__Vector_impl_data._M_finish[-1];
    mode = aiTextureMapping_BOX;
    break;
  case MESH:
  case ANIMMESH:
    local_80 = (aiNode *)CONCAT44(local_80._4_4_,(float)local_80);
    if ((root->meshPath)._M_string_length != 0) {
      paVar6 = BatchLoader::GetImport(batch,root->id);
      if (paVar6 == (aiScene *)0x0) {
        pLVar10 = DefaultLogger::get();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx,
                       "IRR: Unable to load external file: ",&root->meshPath);
        Logger::error(pLVar10,(char *)CONCAT44(fStack_84,idx));
        std::__cxx11::string::~string((string *)&idx);
      }
      else {
        idx = (int)paVar6;
        fStack_84 = (float)((ulong)paVar6 >> 0x20);
        local_80 = rootOut;
        std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::
        emplace_back<Assimp::AttachmentInfo>(attach,(AttachmentInfo *)&idx);
        uVar15 = (ulong)paVar6->mNumMaterials;
        if ((long)(root->materials).
                  super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(root->materials).
                  super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4 == uVar15) {
          lVar12 = 0;
          local_68 = meshes;
          for (uVar18 = 0; meshes = local_68, uVar18 < uVar15; uVar18 = uVar18 + 1) {
            paVar14 = *(aiMaterial **)((long)paVar6->mMaterials + lVar12);
            if (paVar14 != (aiMaterial *)0x0) {
              aiMaterial::~aiMaterial(paVar14);
            }
            operator_delete(paVar14,0x10);
            *(undefined8 *)((long)paVar6->mMaterials + lVar12) =
                 *(undefined8 *)
                  ((long)&((root->materials).
                           super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first + lVar12 * 2);
            uVar15 = (ulong)paVar6->mNumMaterials;
            lVar12 = lVar12 + 8;
          }
          for (uVar15 = 0; uVar15 < paVar6->mNumMeshes; uVar15 = uVar15 + 1) {
            paVar7 = paVar6->mMeshes[uVar15];
            ppVar3 = (root->materials).
                     super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ppVar16 = ppVar3 + paVar7->mMaterialIndex;
            paVar14 = ppVar3[paVar7->mMaterialIndex].first;
            paVar4 = paVar7->mColors[0];
            uVar11 = paVar7->mNumVertices;
            uVar5 = uVar11;
            if ((uVar11 != 0 && paVar4 != (aiColor4D *)0x0) &&
               (uVar5 = 1, (ppVar16->second & 1) != 0)) {
              lVar12 = 0;
LAB_0041345d:
              if ((ulong)uVar11 << 4 != lVar12 + 0x10) goto code_r0x00413466;
              local_60 = ppVar16;
              pLVar10 = DefaultLogger::get();
              Logger::info(pLVar10,"IRR: Replacing mesh vertex alpha with common opacity");
              lVar12 = 0xc;
              for (uVar18 = 0; uVar18 < paVar7->mNumVertices; uVar18 = uVar18 + 1) {
                *(undefined4 *)((long)&paVar7->mColors[0]->r + lVar12) = 0x3f800000;
                lVar12 = lVar12 + 0x10;
              }
              aiMaterial::AddProperty(paVar14,&paVar7->mColors[0]->a,1,"$mat.opacity",0,0);
              ppVar16 = local_60;
              uVar5 = paVar7->mNumVertices;
            }
LAB_004134ec:
            uVar11 = 1;
            if ((paVar7->mTextureCoords[1] != (aiVector3D *)0x0) && (uVar5 != 0)) {
              idx = 1;
              if (((ppVar16->second & 0x10002) != 0) ||
                 (uVar11 = 6, (ppVar16->second >> 8 & 1) != 0)) {
                aiMaterial::AddProperty(paVar14,&idx,1,"$tex.uvwsrc",uVar11,0);
              }
            }
          }
        }
        else {
          pLVar10 = DefaultLogger::get();
          Logger::warn(pLVar10,
                       "IRR: Failed to match imported materials with the materials found in the IRR scene file"
                      );
        }
      }
    }
    goto switchD_00412e0b_caseD_4;
  case SKYBOX:
    if (0x5f < (ulong)((long)(root->materials).
                             super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(root->materials).
                            super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::reserve
                (materials,
                 ((long)(materials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(materials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)
                        ._M_impl.super__Vector_impl_data._M_start >> 3) + 6);
      for (lVar12 = 0; lVar12 != 0x60; lVar12 = lVar12 + 0x10) {
        std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::insert
                  (materials,
                   (const_iterator)
                   (materials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                   (value_type *)
                   ((long)&((root->materials).
                            super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->first + lVar12));
      }
      pIVar13 = (IRRImporter *)&stack0xffffffffffffffb8;
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::vector
                ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&stack0xffffffffffffffb8,
                 materials);
      BuildSkybox(pIVar13,meshes,
                  (vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&stack0xffffffffffffffb8);
      std::_Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~_Vector_base
                ((_Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                 &stack0xffffffffffffffb8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx,
                     "IRR.SkyBox_",&root->name);
      std::__cxx11::string::operator=((string *)&root->name,(string *)&idx);
      std::__cxx11::string::~string((string *)&idx);
      pLVar10 = DefaultLogger::get();
      Logger::info(pLVar10,
                   "IRR: Loading skybox, this will require special handling to be displayed correctly"
                  );
      goto switchD_00412e0b_caseD_4;
    }
    pLVar10 = DefaultLogger::get();
    message = "IRR: There should be six materials for a skybox";
    goto LAB_00413008;
  default:
    goto switchD_00412e0b_caseD_4;
  case TERRAIN:
    pLVar10 = DefaultLogger::get();
    message = "IRR: Unsupported node - TERRAIN";
LAB_00413008:
    Logger::error(pLVar10,message);
    goto switchD_00412e0b_caseD_4;
  case SPHERE:
    uVar5 = root->spherePolyCountY * root->spherePolyCountX;
    uVar11 = 2;
    if (99 < uVar5) {
      uVar11 = 4 - (uVar5 < 300);
    }
    paVar7 = StandardShapes::MakeMesh(uVar11,StandardShapes::MakeSphere);
    idx = (int)paVar7;
    fStack_84 = (float)((ulong)paVar7 >> 0x20);
    std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)meshes,(aiMesh **)&idx);
    pIVar13 = (IRRImporter *)&root->scaling;
    aiVector3t<float>::operator*=((aiVector3t<float> *)pIVar13,root->sphereRadius * 0.5);
    CopyMaterial(pIVar13,materials,&root->materials,defMatIdx,
                 (meshes->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish[-1]);
    paVar14 = (materials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
              super__Vector_impl_data._M_finish[-1];
    mode = aiTextureMapping_SPHERE;
  }
  local_80._0_4_ = -1.0;
  fStack_84 = 0.0;
  idx = 0;
  SetupMapping(paVar14,mode,(aiVector3D *)&idx);
switchD_00412e0b_caseD_4:
  iVar17 = (int)(local_58 >> 3);
  uVar11 = (int)((ulong)((long)(meshes->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(meshes->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 3) - iVar17;
  uVar15 = (ulong)uVar11;
  if (uVar11 != 0) {
    rootOut->mNumMeshes = uVar11;
    puVar9 = (uint *)operator_new__(uVar15 * 4);
    rootOut->mMeshes = puVar9;
    for (uVar18 = 0; uVar18 < uVar15; uVar18 = uVar18 + 1) {
      rootOut->mMeshes[uVar18] = iVar17 + (int)uVar18;
      uVar15 = (ulong)rootOut->mNumMeshes;
    }
  }
  uVar15 = (root->name)._M_string_length;
  if (uVar15 < 0x400) {
    (rootOut->mName).length = (ai_uint32)uVar15;
    memcpy((rootOut->mName).data,(root->name)._M_dataplus._M_p,uVar15);
    (rootOut->mName).data[uVar15] = '\0';
  }
  aVar19 = ::operator*(&root->rotation,0.017453292);
  idx = (int)aVar19.x;
  fStack_84 = aVar19.y;
  local_80._0_4_ = aVar19.z;
  aiMatrix4x4t<float>::FromEulerAnglesXYZ(&rootOut->mTransformation,(aiVector3t<float> *)&idx);
  (rootOut->mTransformation).a1 = (root->scaling).x * (rootOut->mTransformation).a1;
  (rootOut->mTransformation).b1 = (root->scaling).x * (rootOut->mTransformation).b1;
  (rootOut->mTransformation).c1 = (root->scaling).x * (rootOut->mTransformation).c1;
  (rootOut->mTransformation).a2 = (root->scaling).y * (rootOut->mTransformation).a2;
  (rootOut->mTransformation).b2 = (root->scaling).y * (rootOut->mTransformation).b2;
  (rootOut->mTransformation).c2 = (root->scaling).y * (rootOut->mTransformation).c2;
  (rootOut->mTransformation).a3 = (root->scaling).z * (rootOut->mTransformation).a3;
  (rootOut->mTransformation).b3 = (root->scaling).z * (rootOut->mTransformation).b3;
  (rootOut->mTransformation).c3 = (root->scaling).z * (rootOut->mTransformation).c3;
  (rootOut->mTransformation).a4 = (root->position).x + (rootOut->mTransformation).a4;
  (rootOut->mTransformation).b4 = (root->position).y + (rootOut->mTransformation).b4;
  (rootOut->mTransformation).c4 = (root->position).z + (rootOut->mTransformation).c4;
  ComputeAnimations(this,root,rootOut,anims);
  uVar15 = (long)(root->children).
                 super__Vector_base<Assimp::IRRImporter::Node_*,_std::allocator<Assimp::IRRImporter::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(root->children).
                 super__Vector_base<Assimp::IRRImporter::Node_*,_std::allocator<Assimp::IRRImporter::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar18 = uVar15 >> 3;
  rootOut->mNumChildren = (uint)uVar18;
  if ((uint)uVar18 != 0) {
    ppaVar8 = (aiNode **)operator_new__(uVar15 & 0x7fffffff8);
    rootOut->mChildren = ppaVar8;
    for (uVar15 = 0; uVar15 < (uVar18 & 0xffffffff); uVar15 = uVar15 + 1) {
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00);
      rootOut->mChildren[uVar15] = this_00;
      this_00->mParent = rootOut;
      GenerateGraph(this,(root->children).
                         super__Vector_base<Assimp::IRRImporter::Node_*,_std::allocator<Assimp::IRRImporter::Node_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar15],this_00,local_50,batch,
                    meshes,anims,attach,materials,defMatIdx);
      uVar18 = (ulong)rootOut->mNumChildren;
    }
  }
  return;
code_r0x00413466:
  fVar2 = *(float *)((long)&paVar4[1].a + lVar12);
  pfVar1 = (float *)((long)&paVar4->a + lVar12);
  uVar5 = 1;
  if ((fVar2 != *pfVar1) || (lVar12 = lVar12 + 0x10, NAN(fVar2) || NAN(*pfVar1))) goto LAB_004134ec;
  goto LAB_0041345d;
}

Assistant:

void IRRImporter::GenerateGraph(Node* root,aiNode* rootOut ,aiScene* scene,
    BatchLoader& batch,
    std::vector<aiMesh*>&        meshes,
    std::vector<aiNodeAnim*>&    anims,
    std::vector<AttachmentInfo>& attach,
    std::vector<aiMaterial*>&    materials,
    unsigned int&                defMatIdx)
{
    unsigned int oldMeshSize = (unsigned int)meshes.size();
    //unsigned int meshTrafoAssign = 0;

    // Now determine the type of the node
    switch (root->type)
    {
    case Node::ANIMMESH:
    case Node::MESH:
        {
            if (!root->meshPath.length())
                break;

            // Get the loaded mesh from the scene and add it to
            // the list of all scenes to be attached to the
            // graph we're currently building
            aiScene* localScene = batch.GetImport(root->id);
            if (!localScene) {
                ASSIMP_LOG_ERROR("IRR: Unable to load external file: " + root->meshPath);
                break;
            }
            attach.push_back(AttachmentInfo(localScene,rootOut));

            // Now combine the material we've loaded for this mesh
            // with the real materials we got from the file. As we
            // don't execute any pp-steps on the file, the numbers
            // should be equal. If they are not, we can impossibly
            // do this  ...
            if (root->materials.size() != (unsigned int)localScene->mNumMaterials)   {
                ASSIMP_LOG_WARN("IRR: Failed to match imported materials "
                    "with the materials found in the IRR scene file");

                break;
            }
            for (unsigned int i = 0; i < localScene->mNumMaterials;++i)  {
                // Delete the old material, we don't need it anymore
                delete localScene->mMaterials[i];

                std::pair<aiMaterial*, unsigned int>& src = root->materials[i];
                localScene->mMaterials[i] = src.first;
            }

            // NOTE: Each mesh should have exactly one material assigned,
            // but we do it in a separate loop if this behaviour changes
            // in future.
            for (unsigned int i = 0; i < localScene->mNumMeshes;++i) {
                // Process material flags
                aiMesh* mesh = localScene->mMeshes[i];


                // If "trans_vertex_alpha" mode is enabled, search all vertex colors
                // and check whether they have a common alpha value. This is quite
                // often the case so we can simply extract it to a shared oacity
                // value.
                std::pair<aiMaterial*, unsigned int>& src = root->materials[mesh->mMaterialIndex];
                aiMaterial* mat = (aiMaterial*)src.first;

                if (mesh->HasVertexColors(0) && src.second & AI_IRRMESH_MAT_trans_vertex_alpha)
                {
                    bool bdo = true;
                    for (unsigned int a = 1; a < mesh->mNumVertices;++a)    {

                        if (mesh->mColors[0][a].a != mesh->mColors[0][a-1].a)   {
                            bdo = false;
                            break;
                        }
                    }
                    if (bdo)    {
                        ASSIMP_LOG_INFO("IRR: Replacing mesh vertex alpha with common opacity");

                        for (unsigned int a = 0; a < mesh->mNumVertices;++a)
                            mesh->mColors[0][a].a = 1.f;

                        mat->AddProperty(& mesh->mColors[0][0].a, 1, AI_MATKEY_OPACITY);
                    }
                }

                // If we have a second texture coordinate set and a second texture
                // (either lightmap, normalmap, 2layered material) we need to
                // setup the correct UV index for it. The texture can either
                // be diffuse (lightmap & 2layer) or a normal map (normal & parallax)
                if (mesh->HasTextureCoords(1))  {

                    int idx = 1;
                    if (src.second & (AI_IRRMESH_MAT_solid_2layer | AI_IRRMESH_MAT_lightmap))   {
                        mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_DIFFUSE(0));
                    }
                    else if (src.second & AI_IRRMESH_MAT_normalmap_solid)   {
                        mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_NORMALS(0));
                    }
                }
            }
        }
        break;

    case Node::LIGHT:
    case Node::CAMERA:

        // We're already finished with lights and cameras
        break;


    case Node::SPHERE:
        {
            // Generate the sphere model. Our input parameter to
            // the sphere generation algorithm is the number of
            // subdivisions of each triangle - but here we have
            // the number of poylgons on a specific axis. Just
            // use some hardcoded limits to approximate this ...
            unsigned int mul = root->spherePolyCountX*root->spherePolyCountY;
            if      (mul < 100)mul = 2;
            else if (mul < 300)mul = 3;
            else               mul = 4;

            meshes.push_back(StandardShapes::MakeMesh(mul,
                &StandardShapes::MakeSphere));

            // Adjust scaling
            root->scaling *= root->sphereRadius/2;

            // Copy one output material
            CopyMaterial(materials, root->materials, defMatIdx, meshes.back());

            // Now adjust this output material - if there is a first texture
            // set, setup spherical UV mapping around the Y axis.
            SetupMapping ( (aiMaterial*) materials.back(), aiTextureMapping_SPHERE);
        }
        break;

    case Node::CUBE:
        {
            // Generate an unit cube first
            meshes.push_back(StandardShapes::MakeMesh(
                &StandardShapes::MakeHexahedron));

            // Adjust scaling
            root->scaling *= root->sphereRadius;

            // Copy one output material
            CopyMaterial(materials, root->materials, defMatIdx, meshes.back());

            // Now adjust this output material - if there is a first texture
            // set, setup cubic UV mapping
            SetupMapping ( (aiMaterial*) materials.back(), aiTextureMapping_BOX );
        }
        break;


    case Node::SKYBOX:
        {
            // A skybox is defined by six materials
            if (root->materials.size() < 6) {
                ASSIMP_LOG_ERROR("IRR: There should be six materials for a skybox");
                break;
            }

            // copy those materials and generate 6 meshes for our new skybox
            materials.reserve(materials.size() + 6);
            for (unsigned int i = 0; i < 6;++i)
                materials.insert(materials.end(),root->materials[i].first);

            BuildSkybox(meshes,materials);

            // *************************************************************
            // Skyboxes will require a different code path for rendering,
            // so there must be a way for the user to add special support
            // for IRR skyboxes. We add a 'IRR.SkyBox_' prefix to the node.
            // *************************************************************
            root->name = "IRR.SkyBox_" + root->name;
            ASSIMP_LOG_INFO("IRR: Loading skybox, this will "
                "require special handling to be displayed correctly");
        }
        break;

    case Node::TERRAIN:
        {
            // to support terrains, we'd need to have a texture decoder
            ASSIMP_LOG_ERROR("IRR: Unsupported node - TERRAIN");
        }
        break;
    default:
        // DUMMY
        break;
    };

    // Check whether we added a mesh (or more than one ...). In this case
    // we'll also need to attach it to the node
    if (oldMeshSize != (unsigned int) meshes.size())    {

        rootOut->mNumMeshes = (unsigned int)meshes.size() - oldMeshSize;
        rootOut->mMeshes    = new unsigned int[rootOut->mNumMeshes];

        for (unsigned int a = 0; a  < rootOut->mNumMeshes;++a)  {
            rootOut->mMeshes[a] = oldMeshSize+a;
        }
    }

    // Setup the name of this node
    rootOut->mName.Set(root->name);

    // Now compute the final local transformation matrix of the
    // node from the given translation, rotation and scaling values.
    // (the rotation is given in Euler angles, XYZ order)
    //std::swap((float&)root->rotation.z,(float&)root->rotation.y);
    rootOut->mTransformation.FromEulerAnglesXYZ(AI_DEG_TO_RAD(root->rotation) );

    // apply scaling
    aiMatrix4x4& mat = rootOut->mTransformation;
    mat.a1 *= root->scaling.x;
    mat.b1 *= root->scaling.x;
    mat.c1 *= root->scaling.x;
    mat.a2 *= root->scaling.y;
    mat.b2 *= root->scaling.y;
    mat.c2 *= root->scaling.y;
    mat.a3 *= root->scaling.z;
    mat.b3 *= root->scaling.z;
    mat.c3 *= root->scaling.z;

    // apply translation
    mat.a4 += root->position.x;
    mat.b4 += root->position.y;
    mat.c4 += root->position.z;

    // now compute animations for the node
    ComputeAnimations(root,rootOut, anims);

    // Add all children recursively. First allocate enough storage
    // for them, then call us again
    rootOut->mNumChildren = (unsigned int)root->children.size();
    if (rootOut->mNumChildren)  {

        rootOut->mChildren = new aiNode*[rootOut->mNumChildren];
        for (unsigned int i = 0; i < rootOut->mNumChildren;++i) {

            aiNode* node = rootOut->mChildren[i] =  new aiNode();
            node->mParent = rootOut;
            GenerateGraph(root->children[i],node,scene,batch,meshes,
                anims,attach,materials,defMatIdx);
        }
    }
}